

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::main(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZVec<int> NumConnected;
  TPZFMatrix<float> KEl1;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> TestFront;
  TPZFMatrix<float> local_4c8;
  _func_int **local_438;
  _func_int **local_430;
  _func_int **local_428;
  TPZVec<long> local_420;
  TPZVec<long> local_400;
  TPZVec<long> local_3e0;
  TPZVec<int> local_3c0;
  TPZFMatrix<float> local_3a0;
  TPZFMatrix<float> local_310;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> local_280;
  
  local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 2;
  local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 2;
  local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_3a0.fElem = (float *)0x0;
  local_3a0.fGiven = (float *)0x0;
  local_3a0.fSize = 0;
  TPZVec<int>::TPZVec(&local_3a0.fPivot.super_TPZVec<int>,0);
  local_3a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3a0.fPivot.super_TPZVec<int>.fStore = local_3a0.fPivot.fExtAlloc;
  local_3a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_3a0.fWork.fStore = (float *)0x0;
  local_3a0.fWork.fNElements = 0;
  local_3a0.fWork.fNAlloc = 0;
  local_3a0.fElem = (float *)operator_new__(0x10);
  if ((local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_3a0.fElem = 4.0;
  if (local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_3a0.fElem[local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow] = 6.0;
  if ((local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_3a0.fElem[1] = 6.0;
  if ((local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_3a0.fElem[local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  TPZVec<long>::TPZVec(&local_3e0,2);
  *local_3e0.fStore = 0;
  local_3e0.fStore[1] = 1;
  local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 4;
  local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 4;
  local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_4c8.fElem = (float *)0x0;
  local_4c8.fGiven = (float *)0x0;
  local_4c8.fSize = 0;
  TPZVec<int>::TPZVec(&local_4c8.fPivot.super_TPZVec<int>,0);
  local_4c8.fPivot.super_TPZVec<int>.fStore = local_4c8.fPivot.fExtAlloc;
  local_4c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_4c8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_4c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_4c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_4c8.fWork.fStore = (float *)0x0;
  local_4c8.fWork.fNElements = 0;
  local_4c8.fWork.fNAlloc = 0;
  local_4c8.fElem = (float *)operator_new__(0x40);
  if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_4c8.fElem = 4.0;
  if (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow] = -6.0;
  if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 2] = 2.0;
  if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3] = 6.0;
  if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 2 + 1] = -6.0;
  if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3 + 1] = -12.0;
  if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 3) ||
     (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 2 + 2] = 4.0;
  if ((2 < local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) &&
     (3 < local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol)) {
    local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3 + 2] = 6.0;
    if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 4) ||
       (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_438 = (_func_int **)&PTR__TPZVec_01813d70;
    local_430 = (_func_int **)&PTR__TPZManVector_01815498;
    local_428 = (_func_int **)&PTR__TPZFMatrix_0181dbe8;
    local_4c8.fElem[local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3 + 3] = 12.0;
    lVar3 = 0;
    lVar2 = 0;
    lVar1 = lVar2;
    do {
      do {
        if (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar2 ||
            local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar1) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar2) ||
           (local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar1)) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(float *)((long)local_4c8.fElem +
                  lVar2 * 4 + lVar3 * local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) =
             local_4c8.fElem
             [local_4c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * lVar2 + lVar1];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      lVar2 = lVar1 + 1;
      lVar3 = lVar3 + 4;
      lVar1 = lVar2;
    } while (lVar2 != 4);
    TPZVec<long>::TPZVec(&local_400,4);
    *local_400.fStore = 0;
    local_400.fStore[1] = 1;
    local_400.fStore[2] = 2;
    local_400.fStore[3] = 3;
    local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 2;
    local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 2;
    local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_428;
    local_310.fElem = (float *)0x0;
    local_310.fGiven = (float *)0x0;
    local_310.fSize = 0;
    TPZVec<int>::TPZVec(&local_310.fPivot.super_TPZVec<int>,0);
    local_310.fPivot.super_TPZVec<int>.fStore = local_310.fPivot.fExtAlloc;
    local_310.fPivot.super_TPZVec<int>._vptr_TPZVec = local_430;
    local_310.fPivot.super_TPZVec<int>.fNElements = 0;
    local_310.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_310.fWork._vptr_TPZVec = local_438;
    local_310.fWork.fStore = (float *)0x0;
    local_310.fWork.fNElements = 0;
    local_310.fWork.fNAlloc = 0;
    local_310.fElem = (float *)operator_new__(0x10);
    if ((local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
       (local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    *local_310.fElem = 3.0;
    if (local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2) {
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_310.fElem[local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow] = 3.0;
    if ((1 < local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) &&
       (0 < local_3a0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol)) {
      local_3a0.fElem[1] = 3.0;
      if ((1 < local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) &&
         (1 < local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol)) {
        local_310.fElem[local_310.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow + 1] = 6.0;
        TPZVec<long>::TPZVec(&local_420,2);
        *local_420.fStore = 2;
        local_420.fStore[1] = 3;
        TPZFrontMatrix(&local_280,4);
        TPZVec<int>::TPZVec(&local_3c0,4);
        local_3c0.fStore[0] = 2;
        local_3c0.fStore[1] = 2;
        local_3c0.fStore[2] = 2;
        local_3c0.fStore[3] = 2;
        SetNumElConnected(&local_280,&local_3c0);
        SymbolicAddKel(&local_280,&local_3e0);
        SymbolicAddKel(&local_280,&local_400);
        SymbolicAddKel(&local_280,&local_420);
        TPZFrontNonSym<float>::AllocData(&local_280.fFront);
        local_280.fLastDecomposed = -1;
        SetNumElConnected(&local_280,&local_3c0);
        AddKel(&local_280,&local_3a0,&local_3e0);
        AddKel(&local_280,&local_4c8,&local_400);
        AddKel(&local_280,&local_310,&local_420);
        local_3c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        if (local_3c0.fStore != (int *)0x0) {
          operator_delete__(local_3c0.fStore);
        }
        ~TPZFrontMatrix(&local_280,
                        &TPZFrontMatrix<float,TPZFileEqnStorage<float>,TPZFrontNonSym<float>>::VTT);
        local_420._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_420.fStore != (long *)0x0) {
          operator_delete__(local_420.fStore);
        }
        TPZFMatrix<float>::~TPZFMatrix(&local_310);
        local_400._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_400.fStore != (long *)0x0) {
          operator_delete__(local_400.fStore);
        }
        TPZFMatrix<float>::~TPZFMatrix(&local_4c8);
        local_3e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_3e0.fStore != (long *)0x0) {
          operator_delete__(local_3e0.fStore);
        }
        TPZFMatrix<float>::~TPZFMatrix(&local_3a0);
        return;
      }
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}